

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O2

void Ssw_ManUpdateEquivs(Ssw_Man_t *p,Aig_Man_t *pAig,int fVerbose)

{
  Aig_Obj_t *pAVar1;
  Vec_Ptr_t *__ptr;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  __ptr = Aig_ManDfsNodes(pAig,(Aig_Obj_t **)
                               (pAig->vCos->pArray + ((long)pAig->nTruePos - (long)pAig->nConstrs)),
                          pAig->nConstrs);
  iVar6 = 0;
  iVar8 = 0;
  for (lVar7 = 0; lVar7 < pAig->vObjs->nSize; lVar7 = lVar7 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vObjs,(int)lVar7);
    iVar5 = iVar8;
    if ((pvVar2 != (void *)0x0) &&
       ((uVar3 = (uint)*(undefined8 *)((long)pvVar2 + 0x18), (uVar3 & 7) == 2 ||
        (0xfffffffd < (uVar3 & 7) - 7)))) {
      pAVar1 = pAig->pReprs[lVar7];
      iVar4 = iVar8 + 1;
      iVar5 = iVar4;
      if (pAVar1 == (Aig_Obj_t *)0x0) {
        iVar5 = iVar8;
      }
      if ((((*(int *)((long)pvVar2 + 0x20) == pAig->nTravIds) &&
           (iVar5 = iVar8, pAVar1 != (Aig_Obj_t *)0x0)) && (iVar5 = iVar4, p->pPars->fConstrs != 0))
         && (p->pPars->fMergeFull == 0)) {
        pAig->pReprs[lVar7] = (Aig_Obj_t *)0x0;
        iVar6 = iVar6 + 1;
      }
    }
    iVar8 = iVar5;
  }
  p->nConesTotal = pAig->nObjs[5] + pAig->nObjs[2] + pAig->nObjs[6];
  p->nConesConstr = __ptr->nSize;
  p->nEquivsTotal = iVar8;
  p->nEquivsConstr = iVar6;
  free(__ptr->pArray);
  free(__ptr);
  return;
}

Assistant:

void Ssw_ManUpdateEquivs( Ssw_Man_t * p, Aig_Man_t * pAig, int fVerbose )
{
    Vec_Ptr_t * vCones;
    Aig_Obj_t ** pArray;
    Aig_Obj_t * pObj;
    int i, nTotal = 0, nRemoved = 0;
    // collect the nodes in the cone of constraints
    pArray  = (Aig_Obj_t **)Vec_PtrArray(pAig->vCos);
    pArray += Saig_ManPoNum(pAig) - Saig_ManConstrNum(pAig);
    vCones  = Aig_ManDfsNodes( pAig, pArray, Saig_ManConstrNum(pAig) );
    // remove all the node that are equiv to something and are in the cones
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( pAig->pReprs[i] != NULL )
            nTotal++;
        if ( !Aig_ObjIsTravIdCurrent(pAig, pObj) )
            continue;
        if ( pAig->pReprs[i] )
        {
            if ( p->pPars->fConstrs && !p->pPars->fMergeFull )
            {
                pAig->pReprs[i] = NULL;
                nRemoved++;
            }
        }
    }
    // collect statistics    
    p->nConesTotal   = Aig_ManCiNum(pAig) + Aig_ManNodeNum(pAig);
    p->nConesConstr  = Vec_PtrSize(vCones);
    p->nEquivsTotal  = nTotal;
    p->nEquivsConstr = nRemoved;
    Vec_PtrFree( vCones );
}